

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_makers.hpp
# Opt level: O0

void so_5::details::handlers_bunch_basics_t::prepare_handlers
               (msg_type_and_handler_pair_t *left,msg_type_and_handler_pair_t *right)

{
  allocator local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  msg_type_and_handler_pair_t *local_20;
  msg_type_and_handler_pair_t *duplicate;
  msg_type_and_handler_pair_t *right_local;
  msg_type_and_handler_pair_t *left_local;
  
  duplicate = right;
  right_local = left;
  std::sort<so_5::details::msg_type_and_handler_pair_t*>(left,right);
  local_20 = std::adjacent_find<so_5::details::msg_type_and_handler_pair_t*>(right_local,duplicate);
  if (local_20 != duplicate) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_60,"several handlers are defined for message; msg_type: ",&local_61);
    std::type_index::name(&local_20->m_msg_type);
    std::operator+(local_40,(char *)local_60);
    exception_t::raise(0x51a32f);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return;
}

Assistant:

static inline void
		prepare_handlers(
			msg_type_and_handler_pair_t * left,
			msg_type_and_handler_pair_t * right )
			{
				std::sort( left, right );
				auto duplicate = std::adjacent_find( left, right );
				if( duplicate != right )
					SO_5_THROW_EXCEPTION( rc_several_handlers_for_one_message_type,
							std::string( "several handlers are defined for message; "
									"msg_type: " ) + duplicate->m_msg_type.name() );
			}